

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestVC.cxx
# Opt level: O0

string * __thiscall
cmCTestVC::ComputeCommandLine_abi_cxx11_(string *__return_storage_ptr__,cmCTestVC *this,char **cmd)

{
  ostream *poVar1;
  cmCTestVC *local_1a0;
  char **arg;
  char *sep;
  ostringstream line;
  char **cmd_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&sep);
  arg = (char **)0x88e6c0;
  for (local_1a0 = this; local_1a0->_vptr_cmCTestVC != (_func_int **)0x0;
      local_1a0 = (cmCTestVC *)&local_1a0->CTest) {
    poVar1 = std::operator<<((ostream *)&sep,(char *)arg);
    poVar1 = std::operator<<(poVar1,"\"");
    poVar1 = std::operator<<(poVar1,(char *)local_1a0->_vptr_cmCTestVC);
    std::operator<<(poVar1,"\"");
    arg = (char **)0x86dc52;
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&sep);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestVC::ComputeCommandLine(char const* const* cmd)
{
  std::ostringstream line;
  const char* sep = "";
  for (const char* const* arg = cmd; *arg; ++arg) {
    line << sep << "\"" << *arg << "\"";
    sep = " ";
  }
  return line.str();
}